

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O0

int graph_5_4::prim_5(m_graph g)

{
  code *pcVar1;
  int iVar2;
  undefined4 *puVar3;
  undefined4 *puVar4;
  undefined4 auStack_58 [2];
  undefined1 *local_50;
  undefined4 *local_48;
  undefined4 *local_40;
  int local_38;
  int local_34;
  int p;
  int i_1;
  int i;
  int k;
  int j;
  int min;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  
  puVar4 = (undefined4 *)
           ((long)auStack_58 - ((ulong)(uint)g.vexs[8] * 4 + 0xf & 0xfffffffffffffff0));
  puVar3 = (undefined4 *)((long)puVar4 - ((ulong)(uint)g.vexs[8] * 4 + 0xf & 0xfffffffffffffff0));
  for (p = 1; p < g.vexs[8]; p = p + 1) {
    puVar4[p] = *(undefined4 *)(&stack0x00000008 + (long)p * 4);
    puVar3[p] = 0;
  }
  local_50 = &stack0x00000008;
  local_48 = puVar4;
  local_40 = puVar3;
  _j = (ulong)(uint)g.vexs[8];
  __vla_expr1 = (ulong)(uint)g.vexs[8];
  __vla_expr0 = (unsigned_long)auStack_58;
  *puVar4 = 0;
  *puVar3 = 0;
  for (local_34 = 1; local_34 < *(int *)(local_50 + 0x1b8); local_34 = local_34 + 1) {
    k = -1;
    i = 1;
    i_1 = 0;
    while (i < *(int *)(local_50 + 0x1b8)) {
      if ((local_48[local_34] != 0) && ((int)local_48[i] < k)) {
        k = local_48[i];
        i_1 = i;
      }
      iVar2 = i + 1;
      local_48[i_1] = 0;
      for (local_38 = 1; i = iVar2, local_38 < *(int *)(local_50 + 0x1b8); local_38 = local_38 + 1)
      {
        if ((local_48[local_38] != 0) &&
           ((int)local_48[local_38] < *(int *)(local_50 + (long)local_38 * 4 + (long)i_1 * 0x28))) {
          local_48[local_38] = *(undefined4 *)(local_50 + (long)local_38 * 4 + (long)i_1 * 0x28);
          local_40[local_38] = i_1;
        }
      }
    }
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int prim_5(m_graph g) {
        int dis[g.vnum], adjvex[g.vnum], min, j, k;
        for (int i = 1; i < g.vnum; i++) {
            dis[i] = g.arc[0][i];
            adjvex[i] = 0;
        }
        dis[0] = 0;
        adjvex[0] = 0;

        for (int i = 1; i < g.vnum; i++) {
            min = INTMAX_MAX, j = 1, k = 0;
            while (j < g.vnum) {
                if (dis[i] != 0 && dis[j] < min) {
                    min = dis[j];
                    k = j;
                }
                //visit(k);
                j++;
                dis[k] = 0;
                for (int p = 1; p < g.vnum; p++) {
                    if (dis[p] != 0 && dis[p] < g.arc[k][p]) {
                        dis[p] = g.arc[k][p];
                        adjvex[p] = k;
                    }
                }
            }
        }
    }